

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

char * mpack_node_cstr_alloc(mpack_node_t node,size_t maxlen)

{
  ulong uVar1;
  mpack_tree_error_t p_Var2;
  char *__dest;
  ulong uVar3;
  mpack_error_t mVar4;
  mpack_tree_t *pmVar5;
  mpack_node_data_t *pmVar6;
  char *__src;
  ulong __n;
  
  pmVar5 = node.tree;
  pmVar6 = node.data;
  if (pmVar5->error != mpack_ok) {
    return (char *)0x0;
  }
  if (maxlen == 0) {
    pmVar5->error = mpack_error_bug;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (char *)0x0;
    }
    mVar4 = mpack_error_bug;
    goto LAB_00109f6f;
  }
  if (pmVar6->type != mpack_type_str) goto LAB_00109f58;
  __n = (ulong)pmVar6->len;
  if (maxlen - 1 < __n) {
    pmVar5->error = mpack_error_too_big;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (char *)0x0;
    }
    mVar4 = mpack_error_too_big;
    goto LAB_00109f6f;
  }
  __src = pmVar5->data + (long)(pmVar6->value).children;
  if (__n == 0) {
LAB_00109f83:
    __dest = (char *)malloc((ulong)(pmVar6->len + 1));
    if (__dest != (char *)0x0) {
      memcpy(__dest,__src,__n);
      __dest[__n] = '\0';
      return __dest;
    }
    pmVar5->error = mpack_error_memory;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (char *)0x0;
    }
    mVar4 = mpack_error_memory;
  }
  else {
    if (*__src != '\0') {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (__n == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (__src[uVar3] != '\0');
      if (__n <= uVar3) goto LAB_00109f83;
    }
LAB_00109f58:
    pmVar5->error = mpack_error_type;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (char *)0x0;
    }
    mVar4 = mpack_error_type;
  }
LAB_00109f6f:
  (*p_Var2)(pmVar5,mVar4);
  return (char *)0x0;
}

Assistant:

char* mpack_node_cstr_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure maxlen makes sense
    if (maxlen < 1) {
        mpack_break("maxlen is zero; you must have room for at least a null-terminator");
        mpack_node_flag_error(node, mpack_error_bug);
        return NULL;
    }

    if (node.data->type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen - 1) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)(node.data->len + 1));
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    ret[node.data->len] = '\0';
    return ret;
}